

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O2

void __thiscall preciseunitOps_inequality1_Test::TestBody(preciseunitOps_inequality1_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  precise_unit u2;
  int eqFailNeg;
  int eqFailPos;
  precise_unit u3;
  precise_unit u1;
  
  eqFailPos = 0;
  eqFailNeg = 0;
  iVar2 = 0;
  for (dVar4 = 1.0; dVar4 < 1.000000000002; dVar4 = dVar4 + 1e-15) {
    for (dVar5 = 1e-11; 1.501e-12 < dVar5; dVar5 = dVar5 + -1e-14) {
      u1._8_8_ = &DAT_000039d2;
      u2.multiplier_ = dVar4 + dVar5;
      u2._8_8_ = &DAT_000039d2;
      u3.multiplier_ = dVar4 - dVar5;
      u3._8_8_ = &DAT_000039d2;
      u1.multiplier_ = dVar4;
      bVar1 = units::precise_unit::operator==(&u1,&u2);
      if (bVar1) {
        eqFailPos = eqFailPos + 1;
      }
      bVar1 = units::precise_unit::operator==(&u1,&u3);
      if (bVar1) {
        iVar2 = iVar2 + 1;
        eqFailNeg = iVar2;
      }
    }
  }
  u2.multiplier_ = (double)((ulong)u2.multiplier_ & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>((internal *)&u1,"eqFailPos","0",&eqFailPos,(int *)&u2);
  if (u1.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u2);
    if (u1._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)u1._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x31a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u3,(Message *)&u2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u3);
    if (u2.multiplier_ != 0.0) {
      (**(code **)(*(long *)u2.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u1.base_units_);
  u2.multiplier_ = (double)((ulong)u2.multiplier_ & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>((internal *)&u1,"eqFailNeg","0",&eqFailNeg,(int *)&u2);
  if (u1.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u2);
    if (u1._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)u1._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x31b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u3,(Message *)&u2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u3);
    if (u2.multiplier_ != 0.0) {
      (**(code **)(*(long *)u2.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u1.base_units_);
  return;
}

Assistant:

TEST(preciseunitOps, inequality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-12)) {
        double diff = 1e-11;
        while (diff > 1.501e-12) {
            auto u1 = precise_unit(start, precise::V);
            auto u2 = precise_unit(start + diff, precise::V);
            auto u3 = precise_unit(start - diff, precise::V);
            if (u1 == u2) {
                ++eqFailPos;
            }
            if (u1 == u3) {
                ++eqFailNeg;
            }
            diff -= 1e-14;
        }
        start += 1e-15;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}